

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O0

void __thiscall Database::addPost(Database *this,int userId,string *content)

{
  sqlite3 *db;
  int iVar1;
  char *pcVar2;
  DatabaseException *this_00;
  ostream *this_01;
  string local_120 [39];
  allocator local_f9;
  string local_f8 [8];
  string error;
  int failure;
  __cxx11 local_c8 [32];
  string local_a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48 [8];
  string query;
  char *local_28;
  char *errorMsg;
  string *content_local;
  Database *pDStack_10;
  int userId_local;
  Database *this_local;
  
  local_28 = (char *)0x0;
  errorMsg = (char *)content;
  content_local._4_4_ = userId;
  pDStack_10 = this;
  std::__cxx11::to_string(local_c8,userId);
  std::operator+((char *)local_a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "insert into posts (user_id, content) values (");
  std::operator+(local_88,(char *)local_a8);
  std::operator+(local_68,local_88);
  std::operator+(local_48,(char *)local_68);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string((string *)local_c8);
  db = this->database;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  iVar1 = sqlite3_exec(db,pcVar2,(sqlite3_callback)0x0,(void *)0x0,&local_28);
  pcVar2 = local_28;
  if (iVar1 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f8,pcVar2,&local_f9);
    std::allocator<char>::~allocator((allocator<char> *)&local_f9);
    sqlite3_free(local_28);
    this_00 = (DatabaseException *)__cxa_allocate_exception(0x28);
    std::operator+((char *)local_120,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "Error while adding post: ");
    DatabaseException::DatabaseException(this_00,local_120);
    __cxa_throw(this_00,&DatabaseException::typeinfo,DatabaseException::~DatabaseException);
  }
  this_01 = std::operator<<((ostream *)&std::cout,"Post added successfully");
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void Database::addPost(int userId, std::string content)
{
	char* errorMsg = nullptr;
	std::string query = "insert into posts (user_id, content) values (" +
						std::to_string(userId) + ",'" + content + "');";

	int failure = sqlite3_exec(database, query.c_str(), nullptr, nullptr, &errorMsg);

	if(failure)
	{
		std::string error(errorMsg);
		sqlite3_free(errorMsg);
		throw DatabaseException("Error while adding post: " + error);
	}
	else
	{
		std::cout << "Post added successfully" << std::endl;
	}
}